

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_extract.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_type *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  string *psVar3;
  byte *pbVar4;
  element_type *this;
  char cVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  char *args;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  byte *pbVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  path local_208;
  undefined1 local_1e0 [8];
  set<long,_std::less<long>,_std::allocator<long>_> extract_indices;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined1 local_190 [8];
  string hed_filename;
  string mrg_filename;
  string nam_filename;
  string output_basename;
  anon_class_40_5_4793491c write_entry;
  string hed_raw;
  string nam_raw;
  undefined1 auStack_98 [8];
  Nam nam;
  shared_ptr<mg::fs::MappedFile> mrg_data;
  path output_dir;
  char *input_basename;
  char local_31;
  bool has_nam;
  
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&extract_indices;
  extract_indices._M_t._M_impl._0_4_ = 0;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  output_dir._M_cmpts = (_List)0x0;
  output_dir._33_7_ = 0;
  extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (1 < argc) {
    iVar9 = 1;
    bVar10 = false;
    pbVar11 = (byte *)0x0;
    do {
      pbVar4 = (byte *)argv[iVar9];
      uVar7 = *pbVar4 - 0x2d;
      if ((uVar7 == 0) && (uVar7 = pbVar4[1] - 0x69, uVar7 == 0)) {
        uVar7 = (uint)pbVar4[2];
      }
      args = (char *)(ulong)-uVar7;
      if (-uVar7 == 0) {
        iVar9 = iVar9 + 1;
        if (argc <= iVar9) {
          main_cold_2();
          goto LAB_001049ce;
        }
        output_basename.field_2._8_8_ =
             strtol(argv[iVar9],
                    (char **)&mrg_data.
                              super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,0);
        if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv[iVar9]) {
          fprintf(_stderr,"Failed to parse index \'%s\'\n");
          goto LAB_001049ce;
        }
        std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_emplace_unique<long&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   local_1e0,(long *)(output_basename.field_2._M_local_buf + 8));
        bVar10 = true;
        pbVar4 = (byte *)output_dir._32_8_;
      }
      else if ((output_dir._32_8_ != 0) &&
              (bVar12 = pbVar11 != (byte *)0x0, pbVar11 = pbVar4, pbVar4 = (byte *)output_dir._32_8_
              , bVar12)) {
        main_cold_1();
        goto LAB_001049ce;
      }
      output_dir._32_8_ = pbVar4;
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
    if (output_dir._32_8_ != 0) {
      psVar1 = &output_dir._M_pathname._M_string_length;
      mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,"%s.hed","");
      mg::string::format<char_const*>
                ((string *)local_190,
                 (string *)
                 &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(string *)output_dir._32_8_,args);
      if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1) {
        operator_delete(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,output_dir._M_pathname._M_string_length + 1);
      }
      mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,"%s.mrg","");
      mg::string::format<char_const*>
                ((string *)((long)&hed_filename.field_2 + 8),
                 (string *)
                 &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(string *)output_dir._32_8_,args);
      if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1) {
        operator_delete(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,output_dir._M_pathname._M_string_length + 1);
      }
      write_entry.output_dir = (path *)&hed_raw._M_string_length;
      hed_raw._M_dataplus._M_p = (pointer)0x0;
      hed_raw._M_string_length._0_1_ = 0;
      bVar12 = mg::fs::read_file((char *)local_190,(string *)&write_entry.output_dir);
      iVar9 = -1;
      if (bVar12) {
        mg::fs::MappedFile::open
                  ((char *)&mrg_data.
                            super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(int)hed_filename.field_2._8_8_);
        std::__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
                  ((__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2> *)
                   &nam.names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                   &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
                  ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                   &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (nam.names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,"%s.nam","");
          mg::string::format<char_const*>
                    ((string *)((long)&mrg_filename.field_2 + 8),
                     (string *)
                     &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(string *)output_dir._32_8_,args);
          if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1) {
            operator_delete(mrg_data.
                            super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,output_dir._M_pathname._M_string_length + 1);
          }
          hed_raw.field_2._8_8_ = &nam_raw._M_string_length;
          nam_raw._M_dataplus._M_p = (pointer)0x0;
          nam_raw._M_string_length._0_1_ = 0;
          nam.names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_98 = (undefined1  [8])0x0;
          nam.names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bVar12 = mg::fs::read_file((char *)mrg_filename.field_2._8_8_,
                                     (string *)((long)&hed_raw.field_2 + 8));
          if (bVar12) {
            local_31 = mg::data::nam_read((string *)((long)&hed_raw.field_2 + 8),(Nam *)auStack_98);
          }
          else {
            local_31 = false;
          }
          this = mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          nam_raw.field_2._8_8_ =
               nam.names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_size =
                   (int)(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_size + 1;
              UNLOCK();
            }
            else {
              *(int *)&(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_size =
                   (int)(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_size + 1;
            }
          }
          mg::data::MappedMrg::parse
                    ((MappedMrg *)&input_basename,(string *)&write_entry.output_dir,
                     (shared_ptr<mg::fs::MappedFile> *)((long)&nam_raw.field_2 + 8));
          if (this != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
          }
          if (input_basename == (char *)0x0) {
            iVar9 = -1;
          }
          else {
            if ((local_31 == '\x01') &&
               (*(long *)(input_basename + 0x18) - *(long *)(input_basename + 0x10) >> 3 !=
                (long)nam.names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_98 >> 5)) {
              fprintf(_stderr,"MRG entry count (%lu) does not match NAM entry count (%lu)\n");
              iVar9 = -1;
            }
            else {
              output_basename.field_2._8_8_ = ".";
              if (pbVar11 != (byte *)0x0) {
                output_basename.field_2._8_8_ = pbVar11;
              }
              std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                        ((path *)&mrg_data.
                                  super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,(char **)((long)&output_basename.field_2 + 8),
                         auto_format);
              p_Var2 = &mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              cVar5 = std::filesystem::status((path *)p_Var2);
              if (((cVar5 == -1) || (cVar5 == '\0')) &&
                 (cVar5 = std::filesystem::create_directories
                                    ((path *)&mrg_data.
                                              super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount), cVar5 == '\0')) {
                main_cold_3();
                iVar9 = -1;
              }
              else {
                std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                          (&local_208,(char **)&output_dir._M_cmpts,auto_format);
                auVar13 = std::filesystem::__cxx11::path::_M_find_extension();
                if (auVar13._8_8_ == 0 || auVar13._0_8_ == 0) {
                  std::filesystem::__cxx11::path::path((path *)((long)&output_basename.field_2 + 8))
                  ;
                }
                else {
                  std::__cxx11::string::substr
                            ((ulong)&extract_indices._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,auVar13._0_8_);
                  std::filesystem::__cxx11::path::path
                            ((path *)((long)&output_basename.field_2 + 8),
                             (string_type *)
                             &extract_indices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             auto_format);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)extract_indices._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                      &local_1a0) {
                    operator_delete((void *)extract_indices._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count,local_1a0._M_allocated_capacity + 1);
                  }
                }
                nam_filename.field_2._8_8_ = &output_basename._M_string_length;
                psVar3 = (string *)(&nam_filename.field_2._M_allocated_capacity + 1);
                std::__cxx11::string::_M_construct<char*>
                          (psVar3,output_basename.field_2._8_8_,
                           (long)&((write_entry.output_basename)->_M_dataplus)._M_p +
                           output_basename.field_2._8_8_);
                std::filesystem::__cxx11::path::~path((path *)((long)&output_basename.field_2 + 8));
                std::filesystem::__cxx11::path::~path(&local_208);
                write_entry.output_basename = (string *)&local_31;
                write_entry.has_nam = (bool *)auStack_98;
                output_basename.field_2._8_8_ = psVar3;
                write_entry.nam = (Nam *)&input_basename;
                write_entry.mrg =
                     (unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> *)
                     p_Var2;
                if (bVar10) {
                  if (extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                      (_Rb_tree_node_base *)&extract_indices) {
                    p_Var6 = extract_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                    do {
                      main::anon_class_40_5_4793491c::operator()
                                ((anon_class_40_5_4793491c *)((long)&output_basename.field_2 + 8),
                                 p_Var6[1]._M_color);
                      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
                    } while (p_Var6 != (_Rb_tree_node_base *)&extract_indices);
                  }
                }
                else if (*(long *)(input_basename + 0x18) != *(long *)(input_basename + 0x10)) {
                  uVar8 = 0;
                  do {
                    main::anon_class_40_5_4793491c::operator()
                              ((anon_class_40_5_4793491c *)((long)&output_basename.field_2 + 8),
                               (uint)uVar8);
                    uVar8 = uVar8 + 1;
                  } while (uVar8 < (ulong)(*(long *)(input_basename + 0x18) -
                                           *(long *)(input_basename + 0x10) >> 3));
                }
                if ((size_type *)nam_filename.field_2._8_8_ != &output_basename._M_string_length) {
                  operator_delete((void *)nam_filename.field_2._8_8_,
                                  output_basename._M_string_length + 1);
                }
                iVar9 = 0;
              }
              std::filesystem::__cxx11::path::~path
                        ((path *)&mrg_data.
                                  super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
            }
            if (input_basename != (char *)0x0) {
              std::default_delete<mg::data::MappedMrg>::operator()
                        ((default_delete<mg::data::MappedMrg> *)&input_basename,
                         (MappedMrg *)input_basename);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_98);
          if ((size_type *)hed_raw.field_2._8_8_ != &nam_raw._M_string_length) {
            operator_delete((void *)hed_raw.field_2._8_8_,
                            CONCAT71(nam_raw._M_string_length._1_7_,
                                     (undefined1)nam_raw._M_string_length) + 1);
          }
          if ((size_type *)mrg_filename.field_2._8_8_ != &nam_filename._M_string_length) {
            operator_delete((void *)mrg_filename.field_2._8_8_,nam_filename._M_string_length + 1);
          }
        }
        if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      if (write_entry.output_dir != (path *)&hed_raw._M_string_length) {
        operator_delete(write_entry.output_dir,
                        CONCAT71(hed_raw._M_string_length._1_7_,(undefined1)hed_raw._M_string_length
                                ) + 1);
      }
      if ((size_type *)hed_filename.field_2._8_8_ != &mrg_filename._M_string_length) {
        operator_delete((void *)hed_filename.field_2._8_8_,mrg_filename._M_string_length + 1);
      }
      if (local_190 != (undefined1  [8])&hed_filename._M_string_length) {
        operator_delete((void *)local_190,hed_filename._M_string_length + 1);
      }
      goto LAB_00104d09;
    }
  }
  main_cold_4();
LAB_001049ce:
  iVar9 = -1;
LAB_00104d09:
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
             local_1e0);
  return iVar9;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  bool targeted_extract = false;
  std::set<long> extract_indices;

  const char *input_basename = nullptr;
  const char *output_path = nullptr;
  for (int i = 1; i < argc; i++) {
    if (!strcmp("-i", argv[i])) {
      // Check it is followed by an index
      if (i + 1 >= argc) {
        fprintf(stderr, "Missing argument for -i\n");
        return -1;
      }

      // Entry specifier
      targeted_extract = true;
      char *endptr;
      long extract_idx = strtol(argv[i + 1], &endptr, 0);
      if (endptr == argv[i + 1]) {
        fprintf(stderr, "Failed to parse index '%s'\n", argv[i + 1]);
        return -1;
      }

      // Add to extract set
      extract_indices.emplace(extract_idx);

      // Skip arg and loop
      i++;
      continue;
    }

    // Basename?
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }

    // Output dir?
    if (output_path == nullptr) {
      output_path = argv[i];
      continue;
    }

    // Invalid state
    usage(argv[0]);
    return -1;
  }

  // Check args are OK
  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Test for input files
  const std::string hed_filename = mg::string::format("%s.hed", input_basename);
  const std::string mrg_filename = mg::string::format("%s.mrg", input_basename);

  // Read raw data for hed file
  std::string hed_raw;
  if (!mg::fs::read_file(hed_filename.c_str(), hed_raw)) {
    return -1;
  }

  // Try and map the mrg data
  std::shared_ptr<mg::fs::MappedFile> mrg_data =
      mg::fs::MappedFile::open(mrg_filename.c_str());
  if (mrg_data == nullptr) {
    return -1;
  }

  // Try and read the NAM table as well. If we can't that's OK
  const std::string nam_filename = mg::string::format("%s.nam", input_basename);
  std::string nam_raw;
  mg::data::Nam nam;
  const bool has_nam = mg::fs::read_file(nam_filename.c_str(), nam_raw) &&
                       nam_read(nam_raw, nam);

  // Parse the MRG data
  auto mrg = mg::data::MappedMrg::parse(hed_raw, mrg_data);
  if (mrg == nullptr) {
    return -1;
  }

  // If we have a NAM and MRG, assert that the filename count matches the entry
  // count
  if (has_nam && mrg->entries().size() != nam.names.size()) {
    fprintf(stderr,
            "MRG entry count (%lu) does not match NAM entry count (%lu)\n",
            mrg->entries().size(), nam.names.size());
    return -1;
  }

  // Ensure output dir exists
  std::filesystem::path output_dir = output_path ? output_path : ".";
  if (!std::filesystem::exists(output_dir) &&
      !std::filesystem::create_directories(output_dir)) {
    fprintf(stderr, "Failed to create output path '%s'\n", output_dir.c_str());
    return -1;
  }

  // Utility method to write an index to an output file
  const std::string output_basename =
      std::filesystem::path(input_basename).stem();
  auto write_entry = [&](unsigned index) -> int {
    std::string output_filename =
        mg::string::format("%s.%08lu.dat", output_basename.c_str(), index);

    // If we have a name table, use that name as well
    if (has_nam) {
      output_filename =
          mg::string::format("%s.%08lu.%s.dat", output_basename.c_str(), index,
                             nam.names[index].c_str());
    }

    auto entry_data = mrg->entry_data(index);
    std::filesystem::path output_path = output_dir;
    output_path.append(output_filename);
    if (!mg::fs::write_file(output_path.c_str(), entry_data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %lu bytes to %s\n", entry_data.size(),
            output_path.c_str());

    return 0;
  };

  // Iterate the mrg entries and emit
  if (!targeted_extract) {
    for (std::vector<std::string>::size_type i = 0; i < mrg->entries().size();
         i++) {
      write_entry(i);
    }
  } else {
    for (long i : extract_indices) {
      write_entry(i);
    }
  }

  return 0;
}